

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_off_ext(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint c;
  int local_34;
  int local_30;
  int minute;
  int hour;
  int sign;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  _hour = Pig::cursor(pig);
  minute = Pig::peek((Pig *)checkpoint);
  if ((minute == 0x2b) || (minute == 0x2d)) {
    Pig::skipN((Pig *)checkpoint,1);
    local_30 = 0;
    local_34 = 0;
    bVar1 = parse_off_hour(this,(Pig *)checkpoint,&local_30);
    if (bVar1) {
      bVar1 = Pig::skip((Pig *)checkpoint,0x3a);
      if ((bVar1) && (bVar1 = parse_off_minute(this,(Pig *)checkpoint,&local_34), !bVar1)) {
        Pig::restoreTo((Pig *)checkpoint,_hour);
        return false;
      }
      this->_offset = local_30 * 0xe10 + local_34 * 0x3c;
      if (minute == 0x2d) {
        this->_offset = -this->_offset;
      }
      c = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(c);
      if (!bVar1) {
        return true;
      }
    }
  }
  Pig::restoreTo((Pig *)checkpoint,_hour);
  return false;
}

Assistant:

bool Datetime::parse_off_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int sign = pig.peek ();
  if (sign == '+' || sign == '-')
  {
    pig.skipN (1);

    int hour {0};
    int minute {0};

    if (parse_off_hour (pig, hour))
    {
      if (pig.skip (':'))
      {
        if (! parse_off_minute (pig, minute))
        {
          pig.restoreTo (checkpoint);
          return false;
        }
      }

      _offset = (hour * 3600) + (minute * 60);
      if (sign == '-')
        _offset = - _offset;

      if (! unicodeLatinDigit (pig.peek ()))
        return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}